

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void string32_suite::test_one(void)

{
  value_type input [6];
  decoder decoder;
  undefined4 local_7c;
  long *local_78 [2];
  long local_68 [2];
  uchar local_58 [8];
  decoder local_50;
  
  local_50.input._M_str = local_58;
  local_58[4] = '\0';
  local_58[5] = 'A';
  local_58[0] = 0xc9;
  local_58[1] = '\x01';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_50.input._M_len = 6;
  local_50.current.view._M_len = 0;
  local_50.current.view._M_str = (uchar *)0x0;
  local_50.current.code = end;
  trial::protocol::bintoken::detail::decoder::next(&local_50);
  local_78[0] = (long *)CONCAT44(local_78[0]._4_4_,local_50.current.code);
  local_7c = 0xc9;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::string32",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x49b,"void string32_suite::test_one()",local_78,&local_7c);
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<unsigned_char_const*>
            ((string *)local_78,local_50.current.view._M_str,
             local_50.current.view._M_str + local_50.current.view._M_len);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[2]>
            ("decoder.value<token::string>()","\"A\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x49c,"void string32_suite::test_one()",(string *)local_78,"A");
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  trial::protocol::bintoken::detail::decoder::next(&local_50);
  local_78[0] = (long *)CONCAT44(local_78[0]._4_4_,local_50.current.code);
  local_7c = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x49e,"void string32_suite::test_one()",local_78,&local_7c);
  return;
}

Assistant:

void test_one()
{
    const value_type input[] = { token::code::string32, 0x01, 0x00, 0x00, 0x00, 0x41 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::string32);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.value<token::string>(), "A");
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}